

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# safe_list.h
# Opt level: O2

void __thiscall
obs::safe_list<obs::slot<void_()>_>::delete_nodes(safe_list<obs::slot<void_()>_> *this,bool all)

{
  node *pnVar1;
  node *pnVar2;
  undefined7 in_register_00000031;
  node *pnVar3;
  node *pnVar4;
  
  std::mutex::lock(&this->m_mutex_nodes);
  if (((int)CONCAT71(in_register_00000031,all) != 0) || (this->m_delete_nodes == true)) {
    pnVar2 = (node *)0x0;
    pnVar1 = this->m_first;
    while (pnVar4 = pnVar1, pnVar3 = pnVar2, pnVar4 != (node *)0x0) {
      pnVar1 = pnVar4->next;
      if ((all) || ((pnVar2 = pnVar4, pnVar4->value == (slot<void_()> *)0x0 && (pnVar4->locks == 0))
                   )) {
        if (pnVar3 == (node *)0x0) {
          this->m_first = pnVar1;
          pnVar2 = pnVar1;
        }
        else {
          pnVar3->next = pnVar1;
          pnVar2 = pnVar3;
        }
        if (pnVar4 == this->m_last) {
          this->m_last = pnVar2;
        }
        if (pnVar4->locks != 0) {
          __assert_fail("!node->locks",
                        "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]observable/./obs/safe_list.h"
                        ,0x186,
                        "void obs::safe_list<obs::slot<void ()>>::delete_nodes(bool) [T = obs::slot<void ()>]"
                       );
        }
        operator_delete(pnVar4);
        pnVar2 = pnVar3;
      }
    }
    this->m_delete_nodes = false;
  }
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return;
}

Assistant:

void delete_nodes(bool all) {
    std::lock_guard<std::mutex> lock(m_mutex_nodes);
    if (!all && !m_delete_nodes)
      return;

    node* prev = nullptr;
    node* next = nullptr;

    for (node* node=m_first; node; node=next) {
      next = node->next;

      if (all || (!node->value && !node->locks)) {
        if (prev) {
          prev->next = next;
          if (node == m_last)
            m_last = prev;
        }
        else {
          m_first = next;
          if (node == m_last)
            m_last = m_first;
        }

        assert(!node->locks);
        delete node;
      }
      else {
        prev = node;
      }
    }

    m_delete_nodes = false;
  }